

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::InitializeUpdateData<unsigned_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t i_1;
  
  pdVar3 = update->data;
  uVar1 = update_info->N;
  uVar2 = update_info->max;
  for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
    uVar7 = uVar6;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)sel->sel_vector[uVar6];
    }
    psVar4 = update->sel->sel_vector;
    if (psVar4 != (sel_t *)0x0) {
      uVar7 = (ulong)psVar4[uVar7];
    }
    *(data_t *)((long)&update_info[1].segment + uVar6 + (ulong)uVar2 * 4) = pdVar3[uVar7];
  }
  pdVar3 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar1 = base_info->max;
  for (uVar6 = 0; uVar6 < base_info->N; uVar6 = uVar6 + 1) {
    uVar7 = (ulong)*(uint *)((long)&base_info[1].segment + uVar6 * 4);
    bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(base_data->validity).super_TemplatedValidityMask<unsigned_long>,uVar7);
    if (bVar5) {
      *(data_t *)((long)&base_info[1].segment + uVar6 + (ulong)uVar1 * 4) = pdVar3[uVar7];
    }
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}